

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall wallet::LegacyScriptPubKeyMan::TopUp(LegacyScriptPubKeyMan *this,uint kpSize)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  runtime_error *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  type *chain;
  type *chain_id;
  unordered_map<CKeyID,_wallet::CHDChain,_SaltedSipHasher,_std::equal_to<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CHDChain>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  WalletBatch batch;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  WalletDatabase *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  undefined5 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2d;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined7 in_stack_ffffffffffffff38;
  bool local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  uint in_stack_ffffffffffffffcc;
  CHDChain *in_stack_ffffffffffffffd0;
  WalletBatch *in_stack_ffffffffffffffd8;
  LegacyScriptPubKeyMan *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CanGenerateKeys((LegacyScriptPubKeyMan *)
                          CONCAT17(in_stack_ffffffffffffff2f,
                                   CONCAT16(in_stack_ffffffffffffff2e,
                                            CONCAT15(in_stack_ffffffffffffff2d,
                                                     in_stack_ffffffffffffff28))));
  if (bVar2) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x18))();
    args = &local_58;
    WalletBatch::WalletBatch
              ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
    uVar3 = WalletBatch::TxnBegin
                      ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08))
    ;
    if ((bool)uVar3) {
      bVar2 = TopUpChain(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                         in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      if (bVar2) {
        std::
        unordered_map<CKeyID,_wallet::CHDChain,_SaltedSipHasher,_std::equal_to<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CHDChain>_>_>
        ::begin((unordered_map<CKeyID,_wallet::CHDChain,_SaltedSipHasher,_std::equal_to<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CHDChain>_>_>
                 *)in_stack_ffffffffffffff10);
        std::
        unordered_map<CKeyID,_wallet::CHDChain,_SaltedSipHasher,_std::equal_to<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CHDChain>_>_>
        ::end((unordered_map<CKeyID,_wallet::CHDChain,_SaltedSipHasher,_std::equal_to<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CHDChain>_>_>
               *)in_stack_ffffffffffffff10);
        while( true ) {
          bVar2 = std::__detail::operator==
                            ((_Node_iterator_base<std::pair<const_CKeyID,_wallet::CHDChain>,_true> *
                             )CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                             (_Node_iterator_base<std::pair<const_CKeyID,_wallet::CHDChain>,_true> *
                             )in_stack_ffffffffffffff10);
          if (((bVar2 ^ 0xffU) & 1) == 0) break;
          std::__detail::_Node_iterator<std::pair<const_CKeyID,_wallet::CHDChain>,_false,_true>::
          operator*((_Node_iterator<std::pair<const_CKeyID,_wallet::CHDChain>,_false,_true> *)
                    CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
          std::get<0ul,CKeyID_const,wallet::CHDChain>
                    ((pair<const_CKeyID,_wallet::CHDChain> *)
                     CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
          std::get<1ul,CKeyID_const,wallet::CHDChain>
                    ((pair<const_CKeyID,_wallet::CHDChain> *)
                     CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
          bVar2 = TopUpChain(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
          if (!bVar2) {
            local_69 = false;
            goto LAB_016716e5;
          }
          std::__detail::_Node_iterator<std::pair<const_CKeyID,_wallet::CHDChain>,_false,_true>::
          operator++((_Node_iterator<std::pair<const_CKeyID,_wallet::CHDChain>,_false,_true> *)
                     CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
        }
        bVar2 = WalletBatch::TxnCommit
                          ((WalletBatch *)
                           CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
        if (!bVar2) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          (**(code **)(**(long **)(in_RDI + 8) + 0x10))(&local_58.field_2);
          tinyformat::format<std::__cxx11::string>
                    ((char *)CONCAT17(uVar3,in_stack_ffffffffffffff38),args);
          std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffffd8);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0167175c;
        }
        boost::signals2::
        signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
        ::operator()((signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
                      *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
        local_69 = true;
      }
      else {
        local_69 = false;
      }
    }
    else {
      local_69 = false;
    }
LAB_016716e5:
    WalletBatch::~WalletBatch
              ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  }
  else {
    local_69 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_69;
  }
LAB_0167175c:
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::TopUp(unsigned int kpSize)
{
    if (!CanGenerateKeys()) {
        return false;
    }

    WalletBatch batch(m_storage.GetDatabase());
    if (!batch.TxnBegin()) return false;
    if (!TopUpChain(batch, m_hd_chain, kpSize)) {
        return false;
    }
    for (auto& [chain_id, chain] : m_inactive_hd_chains) {
        if (!TopUpChain(batch, chain, kpSize)) {
            return false;
        }
    }
    if (!batch.TxnCommit()) throw std::runtime_error(strprintf("Error during keypool top up. Cannot commit changes for wallet %s", m_storage.GetDisplayName()));
    NotifyCanGetAddressesChanged();
    // Note: Unlike with DescriptorSPKM, LegacySPKM does not need to call
    // m_storage.TopUpCallback() as we do not know what new scripts the LegacySPKM is
    // watching for. CWallet's scriptPubKey cache is not used for LegacySPKMs.
    return true;
}